

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_binding_replacer.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnBindingReplacer::VisitExpression
          (ColumnBindingReplacer *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression)

{
  pointer pRVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  element_type *peVar2;
  pointer pEVar3;
  BoundColumnRefExpression *pBVar4;
  type pEVar5;
  undefined8 extraout_RDX;
  LogicalType *other;
  
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expression);
  if ((pEVar3->super_BaseExpression).expression_class == BOUND_COLUMN_REF) {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expression);
    pBVar4 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar3->super_BaseExpression);
    pRVar1 = (this->replacement_bindings).
             super_vector<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>.
             super__Vector_base<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (other = &((this->replacement_bindings).
                   super_vector<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>
                   .
                   super__Vector_base<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>
                   ._M_impl.super__Vector_impl_data._M_start)->new_type;
        (pointer)&other[-2].type_info_ != pRVar1;
        other = (LogicalType *)
                &other[2].type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    {
      if (((element_type *)(pBVar4->binding).table_index ==
           other[-2].type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) &&
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pBVar4->binding).column_index ==
          other[-2].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi))
      {
        peVar2 = other[-1].type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (pBVar4->binding).table_index = *(idx_t *)(other + -1);
        (pBVar4->binding).column_index = (idx_t)peVar2;
        if (*(char *)&other[-1].type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi == '\x01') {
          LogicalType::operator=(&(pBVar4->super_Expression).return_type,other);
        }
      }
    }
  }
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (expression);
  UNRECOVERED_JUMPTABLE = (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[4];
  (*UNRECOVERED_JUMPTABLE)(this,pEVar5,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void ColumnBindingReplacer::VisitExpression(unique_ptr<Expression> *expression) {
	auto &expr = *expression;
	if (expr->GetExpressionClass() == ExpressionClass::BOUND_COLUMN_REF) {
		auto &bound_column_ref = expr->Cast<BoundColumnRefExpression>();
		for (const auto &replace_binding : replacement_bindings) {
			if (bound_column_ref.binding == replace_binding.old_binding) {
				bound_column_ref.binding = replace_binding.new_binding;
				if (replace_binding.replace_type) {
					bound_column_ref.return_type = replace_binding.new_type;
				}
			}
		}
	}

	VisitExpressionChildren(**expression);
}